

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O2

void __thiscall rotate_y::rotate_y(rotate_y *this,shared_ptr<hittable> *object,double angle)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int j;
  int iVar13;
  int k;
  int iVar14;
  int c;
  long lVar15;
  int i;
  int iVar16;
  double local_138;
  double local_130;
  double x;
  vec3 tester;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  point3 local_98;
  point3 local_78;
  undefined1 local_58 [16];
  double local_48;
  undefined8 uStack_40;
  
  (this->super_hittable)._vptr_hittable = (_func_int **)&PTR__rotate_y_00119b70;
  std::__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->object).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>,
             &object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>);
  (this->bbox).x.min = INFINITY;
  (this->bbox).x.max = -INFINITY;
  (this->bbox).y.min = INFINITY;
  (this->bbox).y.max = -INFINITY;
  (this->bbox).z.min = INFINITY;
  (this->bbox).z.max = -INFINITY;
  dVar6 = (angle * 3.141592653589793) / 180.0;
  dVar7 = sin(dVar6);
  this->sin_theta = dVar7;
  dVar6 = cos(dVar6);
  this->cos_theta = dVar6;
  (*((object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_hittable[3])
            (&tester);
  (this->bbox).z.min = local_a8;
  (this->bbox).z.max = dStack_a0;
  (this->bbox).y.min = tester.e[2];
  (this->bbox).y.max = dStack_b0;
  (this->bbox).x.min = tester.e[0];
  (this->bbox).x.max = tester.e[1];
  local_78.e[0] = INFINITY;
  local_78.e[1] = INFINITY;
  local_78.e[2] = INFINITY;
  local_98.e[0] = -INFINITY;
  local_98.e[1] = -INFINITY;
  local_98.e[2] = -INFINITY;
  dVar6 = (this->bbox).x.max;
  dVar7 = (this->bbox).x.min;
  dVar1 = (this->bbox).y.max;
  dVar2 = (this->bbox).y.min;
  dVar3 = (this->bbox).z.max;
  dVar4 = (this->bbox).z.min;
  local_48 = this->sin_theta;
  dVar5 = this->cos_theta;
  uStack_40 = 0;
  local_58._8_4_ = DAT_00112180._8_4_;
  local_58._0_8_ = (ulong)DAT_00112180 ^ (ulong)local_48;
  local_58._12_4_ = DAT_00112180._12_4_;
  local_138 = 0.0;
  for (iVar16 = 0; iVar16 != 2; iVar16 = iVar16 + 1) {
    dVar10 = local_138 * dVar6 + (double)(1 - iVar16) * dVar7;
    local_130 = 0.0;
    dVar8 = (double)local_58._0_8_ * dVar10;
    for (iVar13 = 0; iVar13 != 2; iVar13 = iVar13 + 1) {
      dVar12 = 0.0;
      for (iVar14 = 0; iVar14 != 2; iVar14 = iVar14 + 1) {
        dVar11 = dVar12 * dVar3 + (double)(1 - iVar14) * dVar4;
        tester.e[0] = dVar5 * dVar10 + local_48 * dVar11;
        tester.e[1] = local_130 * dVar1 + (double)(1 - iVar13) * dVar2;
        tester.e[2] = dVar11 * dVar5 + dVar8;
        for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
          dVar11 = tester.e[lVar15];
          dVar9 = fmin(local_78.e[lVar15],dVar11);
          local_78.e[lVar15] = dVar9;
          dVar11 = fmax(local_98.e[lVar15],dVar11);
          local_98.e[lVar15] = dVar11;
        }
        dVar12 = dVar12 + 1.0;
      }
      local_130 = local_130 + 1.0;
    }
    local_138 = local_138 + 1.0;
  }
  aabb::aabb((aabb *)&tester,&local_78,&local_98);
  (this->bbox).z.min = local_a8;
  (this->bbox).z.max = dStack_a0;
  (this->bbox).y.min = tester.e[2];
  (this->bbox).y.max = dStack_b0;
  (this->bbox).x.min = tester.e[0];
  (this->bbox).x.max = tester.e[1];
  return;
}

Assistant:

rotate_y(shared_ptr<hittable> object, double angle) : object(object) {
        auto radians = degrees_to_radians(angle);
        sin_theta = std::sin(radians);
        cos_theta = std::cos(radians);
        bbox = object->bounding_box();

        point3 min( infinity,  infinity,  infinity);
        point3 max(-infinity, -infinity, -infinity);

        for (int i = 0; i < 2; i++) {
            for (int j = 0; j < 2; j++) {
                for (int k = 0; k < 2; k++) {
                    auto x = i*bbox.x.max + (1-i)*bbox.x.min;
                    auto y = j*bbox.y.max + (1-j)*bbox.y.min;
                    auto z = k*bbox.z.max + (1-k)*bbox.z.min;

                    auto newx =  cos_theta*x + sin_theta*z;
                    auto newz = -sin_theta*x + cos_theta*z;

                    vec3 tester(newx, y, newz);

                    for (int c = 0; c < 3; c++) {
                        min[c] = std::fmin(min[c], tester[c]);
                        max[c] = std::fmax(max[c], tester[c]);
                    }
                }
            }
        }

        bbox = aabb(min, max);
    }